

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Clara::Parser::writeToStream(Parser *this,ostream *os)

{
  element_type *peVar1;
  pointer pAVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  HelpColumns *cols;
  ostream *poVar7;
  undefined4 extraout_var;
  pointer pHVar8;
  ulong uVar9;
  ulong uVar10;
  Arg *arg;
  pointer pAVar11;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> rows
  ;
  Columns row;
  Column local_130;
  ulong local_f8;
  size_t local_f0;
  Column local_e8;
  Columns local_b0;
  Column local_98;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  local_60;
  Columns local_48;
  
  if (((this->m_exeName).m_name.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"usage:\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
    peVar1 = (this->m_exeName).m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(peVar1->_M_dataplus)._M_p,peVar1->_M_string_length);
    local_130.m_string._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_130,1);
    pAVar11 = (this->m_args).
              super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar2 = (this->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar11 != pAVar2) {
      bVar4 = true;
      bVar5 = true;
      do {
        if (!bVar5) {
          local_130.m_string._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_130,1);
        }
        if (((pAVar11->super_ParserRefImpl<Catch::Clara::Arg>).m_optionality == Optional) && (bVar4)
           ) {
          local_130.m_string._M_dataplus._M_p._0_1_ = 0x5b;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_130,1);
          bVar4 = false;
        }
        local_130.m_string._M_dataplus._M_p._0_1_ = 0x3c;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_130,1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(pAVar11->super_ParserRefImpl<Catch::Clara::Arg>).m_hint.
                                   _M_dataplus._M_p,
                            (pAVar11->super_ParserRefImpl<Catch::Clara::Arg>).m_hint.
                            _M_string_length);
        local_130.m_string._M_dataplus._M_p._0_1_ = 0x3e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_130,1);
        iVar6 = (*(pAVar11->super_ParserRefImpl<Catch::Clara::Arg>).
                  super_ComposableParserImpl<Catch::Clara::Arg>.super_ParserBase._vptr_ParserBase[4]
                )(pAVar11);
        if (CONCAT44(extraout_var,iVar6) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ... ",5);
        }
        pAVar11 = pAVar11 + 1;
        bVar5 = false;
      } while (pAVar11 != pAVar2);
      if (!bVar4) {
        local_130.m_string._M_dataplus._M_p._0_1_ = 0x5d;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_130,1);
      }
    }
    if ((this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os," options",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n\nwhere options are:\n",0x15);
  }
  getHelpColumns(&local_60,this);
  if (local_60.
      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar8 = local_60.
             super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      uVar10 = (pHVar8->left)._M_string_length + 2;
      if (uVar10 < uVar9) {
        uVar10 = uVar9;
      }
      pHVar8 = pHVar8 + 1;
      uVar9 = uVar10;
    } while (pHVar8 != local_60.
                       super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_f8 = 0x28;
    if (uVar10 < 0x28) {
      local_f8 = uVar10;
    }
    if (local_60.
        super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.
        super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_f0 = 0x49 - local_f8;
      pHVar8 = local_60.
               super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_130.m_string._M_dataplus._M_p = (pointer)&local_130.m_string.field_2;
        pcVar3 = (pHVar8->left)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar3,pcVar3 + (pHVar8->left)._M_string_length);
        local_130.m_width = 0x4f;
        local_130.m_indent = 0;
        local_130.m_initialIndent = 0xffffffffffffffff;
        if (uVar10 == 0) {
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                        ,0x2269,"Column &Catch::TextFlow::Column::width(size_t)");
        }
        local_130.m_width = local_f8;
        local_130.m_indent = 2;
        TextFlow::Spacer(&local_98,4);
        TextFlow::Column::operator+(&local_b0,&local_130,&local_98);
        local_e8.m_string._M_dataplus._M_p = (pointer)&local_e8.m_string.field_2;
        pcVar3 = (pHVar8->right)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar3,pcVar3 + (pHVar8->right)._M_string_length);
        local_e8.m_indent = 0;
        local_e8.m_initialIndent = 0xffffffffffffffff;
        local_e8.m_width = local_f0;
        TextFlow::Columns::operator+(&local_48,&local_b0,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_string._M_dataplus._M_p != &local_e8.m_string.field_2) {
          operator_delete(local_e8.m_string._M_dataplus._M_p,
                          local_e8.m_string.field_2._M_allocated_capacity + 1);
        }
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_b0.m_columns);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.m_string._M_dataplus._M_p != &local_98.m_string.field_2) {
          operator_delete(local_98.m_string._M_dataplus._M_p,
                          local_98.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.m_string._M_dataplus._M_p != &local_130.m_string.field_2) {
          operator_delete(local_130.m_string._M_dataplus._M_p,
                          local_130.m_string.field_2._M_allocated_capacity + 1);
        }
        TextFlow::operator<<(os,&local_48);
        local_130.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_130,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_48.m_columns);
        pHVar8 = pHVar8 + 1;
      } while (pHVar8 != local_60.
                         super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void Parser::writeToStream(std::ostream &os) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n"
                    << "  " << m_exeName.name() << ' ';
                bool required = true, first = true;
                for (auto const &arg : m_args) {
                    if (first)
                        first = false;
                    else
                        os << ' ';
                    if (arg.isOptional() && required) {
                        os << '[';
                        required = false;
                    }
                    os << '<' << arg.hint() << '>';
                    if (arg.cardinality() == 0)
                        os << " ... ";
                }
                if (!required)
                    os << ']';
                if (!m_options.empty())
                    os << " options";
                os << "\n\nwhere options are:\n";
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for (auto const &cols : rows)
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth / 2);

            for (auto const &cols : rows) {
                auto row = TextFlow::Column(cols.left)
                    .width(optWidth)
                    .indent(2) +
                    TextFlow::Spacer(4) +
                    TextFlow::Column(cols.right)
                    .width(consoleWidth - 7 - optWidth);
                os << row << '\n';
            }
        }